

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O1

void HandleVariableRuns(int argc,char **argv)

{
  string_view sVar1;
  _Any_data local_d8;
  code *local_c8;
  code *local_c0;
  _Any_data local_b8;
  code *local_a8;
  code *local_a0;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  if (argc == 1) {
    argv0 = *argv;
    sVar1 = EnvProperty::Get(&HandleVariableRuns::kMarker);
    if (sVar1._M_len == 0) {
      local_b8._M_unused._M_object = (void *)0x0;
      local_b8._8_8_ = 0;
      local_a0 = std::
                 _Function_handler<void_(std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc:1965:18)>
                 ::_M_invoke;
      local_a8 = std::
                 _Function_handler<void_(std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc:1965:18)>
                 ::_M_manager;
      ReSpawnWithEnv((env_override_fn *)&local_b8);
      if (local_a8 != (code *)0x0) {
        (*local_a8)(&local_b8,&local_b8,__destroy_functor);
      }
      local_98._M_unused._M_object = (void *)0x0;
      local_98._8_8_ = 0;
      local_80 = std::
                 _Function_handler<void_(std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc:1969:18)>
                 ::_M_invoke;
      local_88 = std::
                 _Function_handler<void_(std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc:1969:18)>
                 ::_M_manager;
      ReSpawnWithEnv((env_override_fn *)&local_98);
      if (local_88 != (code *)0x0) {
        (*local_88)(&local_98,&local_98,__destroy_functor);
      }
      local_78._M_unused._M_object = (void *)0x0;
      local_78._8_8_ = 0;
      local_60 = std::
                 _Function_handler<void_(std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc:1974:18)>
                 ::_M_invoke;
      local_68 = std::
                 _Function_handler<void_(std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc:1974:18)>
                 ::_M_manager;
      ReSpawnWithEnv((env_override_fn *)&local_78);
      if (local_68 != (code *)0x0) {
        (*local_68)(&local_78,&local_78,__destroy_functor);
      }
      local_58._M_unused._M_object = (void *)0x0;
      local_58._8_8_ = 0;
      local_40 = std::
                 _Function_handler<void_(std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc:1979:18)>
                 ::_M_invoke;
      local_48 = std::
                 _Function_handler<void_(std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc:1979:18)>
                 ::_M_manager;
      ReSpawnWithEnv((env_override_fn *)&local_58);
      if (local_48 != (code *)0x0) {
        (*local_48)(&local_58,&local_58,__destroy_functor);
      }
      local_38._M_unused._M_object = (void *)0x0;
      local_38._8_8_ = 0;
      local_20 = std::
                 _Function_handler<void_(std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc:1985:18)>
                 ::_M_invoke;
      local_28 = std::
                 _Function_handler<void_(std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc:1985:18)>
                 ::_M_manager;
      ReSpawnWithEnv((env_override_fn *)&local_38);
      if (local_28 != (code *)0x0) {
        (*local_28)(&local_38,&local_38,__destroy_functor);
      }
      local_d8._M_unused._M_object = (void *)0x0;
      local_d8._8_8_ = 0;
      local_c0 = std::
                 _Function_handler<void_(std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc:1991:18)>
                 ::_M_invoke;
      local_c8 = std::
                 _Function_handler<void_(std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc:1991:18)>
                 ::_M_manager;
      ReSpawnWithEnv((env_override_fn *)&local_d8);
      std::_Function_base::~_Function_base((_Function_base *)&local_d8);
      exit(0);
    }
  }
  return;
}

Assistant:

void HandleVariableRuns(int argc, char** argv) {
  if (argc != 1) {
    return;
  }

  argv0 = argv[0];

  static constexpr EnvProperty kMarker{"TCMALLOC_UNITTEST_MARKER"};
  static constexpr EnvProperty kTransferNumObjEnv{"TCMALLOC_TRANSFER_NUM_OBJ"};
  static constexpr EnvProperty kAggressiveDecommitEnv{"TCMALLOC_AGGRESSIVE_DECOMMIT"};
  static constexpr EnvProperty kHeapLimitEnv{"TCMALLOC_HEAP_LIMIT_MB"};
  static constexpr EnvProperty kEnableSizedDeleteEnv{"TCMALLOC_ENABLE_SIZED_DELETE"};

  if (!kMarker.Get().empty()) {
    return; // We're unitttest child
  }

  using override_set = EnvProperty::override_set;

  ReSpawnWithEnv([] (override_set* overrides) {
    kMarker.Set(overrides, "_");
  });

  ReSpawnWithEnv([] (override_set* overrides) {
    kTransferNumObjEnv.SetAndPrint(overrides, "40");
    kMarker.Set(overrides, "_");
  });

  ReSpawnWithEnv([] (override_set* overrides) {
    kTransferNumObjEnv.SetAndPrint(overrides, "4096");
    kMarker.Set(overrides, "_");
  });

  ReSpawnWithEnv([] (override_set* overrides) {
    kTransferNumObjEnv.Set(overrides, "");
    kAggressiveDecommitEnv.SetAndPrint(overrides, "t");
    kMarker.Set(overrides, "_");
  });

  ReSpawnWithEnv([] (override_set* overrides) {
    kAggressiveDecommitEnv.Set(overrides, "");
    kHeapLimitEnv.SetAndPrint(overrides, "512");
    kMarker.Set(overrides, "_");
  });

  ReSpawnWithEnv([] (override_set* overrides) {
    kHeapLimitEnv.Set(overrides, "");
    kEnableSizedDeleteEnv.SetAndPrint(overrides, "t");
    kMarker.Set(overrides, "_");
  });

  exit(0);
}